

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.c
# Opt level: O2

void ecs_table_unset(ecs_world_t *world,ecs_table_t *table)

{
  int32_t count;
  ecs_data_t *peVar1;
  
  peVar1 = ecs_table_get_data(table);
  if (peVar1 != (ecs_data_t *)0x0) {
    count = ecs_vector_count(peVar1->entities);
    if (count != 0) {
      ecs_run_monitors(world,table,table->un_set_all,0,count,(ecs_vector_t *)0x0);
      return;
    }
  }
  return;
}

Assistant:

void ecs_table_unset(
    ecs_world_t * world,
    ecs_table_t * table)
{
    (void)world;
    ecs_data_t *data = ecs_table_get_data(table);
    if (data) {
        run_un_set_handlers(world, table, data);
    }   
}